

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS ref_agents_inspect(REF_AGENTS ref_agents)

{
  uint local_14;
  REF_INT id;
  REF_AGENTS ref_agents_local;
  
  for (local_14 = 0; (int)local_14 < ref_agents->max; local_14 = local_14 + 1) {
    if (ref_agents->agent[(int)local_14].mode != REF_AGENT_UNUSED) {
      printf("%2d: %2d mode %2d prev %2d next\n",(ulong)local_14,
             (ulong)ref_agents->agent[(int)local_14].mode,
             (ulong)(uint)ref_agents->agent[(int)local_14].previous,
             (ulong)(uint)ref_agents->agent[(int)local_14].next);
    }
  }
  printf("%d n %d max %d\nblank %d last\n",(ulong)(uint)ref_agents->n,(ulong)(uint)ref_agents->max,
         (ulong)(uint)ref_agents->blank,(ulong)(uint)ref_agents->last);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_agents_inspect(REF_AGENTS ref_agents) {
  REF_INT id;
  for (id = 0; id < ref_agents->max; id++) {
    if (REF_AGENT_UNUSED != ref_agent_mode(ref_agents, id))
      printf("%2d: %2d mode %2d prev %2d next\n", id,
             (int)ref_agent_mode(ref_agents, id),
             ref_agent_previous(ref_agents, id),
             ref_agent_next(ref_agents, id));
  }
  printf("%d n %d max %d\nblank %d last\n", ref_agents->n, ref_agents->max,
         ref_agents->blank, ref_agents->last);

  return REF_SUCCESS;
}